

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFFT.hpp
# Opt level: O0

void __thiscall audiofft::OouraFFT::ifft(OouraFFT *this,float *data,float *re,float *im)

{
  float fVar1;
  size_t sVar2;
  reference pvVar3;
  double *pdVar4;
  int *ip;
  double *pdVar5;
  vector<double,_std::allocator<double>_> *this_00;
  undefined1 auVar6 [16];
  float *local_48;
  float *i;
  float *r;
  double *bEnd;
  double *b;
  float *im_local;
  float *re_local;
  float *data_local;
  OouraFFT *this_local;
  
  bEnd = std::vector<double,_std::allocator<double>_>::data(&this->_buffer);
  pdVar4 = bEnd + this->_size;
  local_48 = im;
  i = re;
  while (bEnd != pdVar4) {
    pdVar5 = bEnd + 1;
    *bEnd = (double)*i;
    bEnd = bEnd + 2;
    *pdVar5 = -(double)*local_48;
    local_48 = local_48 + 1;
    i = i + 1;
  }
  fVar1 = *(float *)((long)re + (this->_size & 0xfffffffffffffffe) * 2);
  this_00 = &this->_buffer;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](this_00,1);
  *pvVar3 = (double)fVar1;
  sVar2 = this->_size;
  pdVar4 = std::vector<double,_std::allocator<double>_>::data(this_00);
  ip = std::vector<int,_std::allocator<int>_>::data(&this->_ip);
  pdVar5 = std::vector<double,_std::allocator<double>_>::data(&this->_w);
  rdft(this,(int)sVar2,-1,pdVar4,ip,pdVar5);
  pdVar4 = std::vector<double,_std::allocator<double>_>::data(this_00);
  sVar2 = this->_size;
  auVar6._8_4_ = (int)(sVar2 >> 0x20);
  auVar6._0_8_ = sVar2;
  auVar6._12_4_ = 0x45300000;
  detail::ScaleBuffer<float,double,double>
            (data,pdVar4,
             2.0 / ((auVar6._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)),this->_size);
  return;
}

Assistant:

virtual void ifft(float* data, const float* re, const float* im) override
        {
          // Convert into the format as required by the Ooura FFT
          {
            double* b = _buffer.data();
            double* bEnd = b + _size;
            const float *r = re;
            const float *i = im;
            while (b != bEnd)
            {
              *(b++) = static_cast<double>(*(r++));
              *(b++) = -static_cast<double>(*(i++));
            }
            _buffer[1] = re[_size / 2];
          }

          rdft(static_cast<int>(_size), -1, _buffer.data(), _ip.data(), _w.data());

          // Convert back to split-complex
          detail::ScaleBuffer(data, _buffer.data(), 2.0 / static_cast<double>(_size), _size);
        }